

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O3

void __thiscall
pbrt::syntactic::Attributes::insertNamedMaterial
          (Attributes *this,string *name,shared_ptr<pbrt::syntactic::Material> *material)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  mapped_type *pmVar1;
  
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Material>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Material>_>_>_>
           ::operator[](&this->namedMaterial,name);
  (pmVar1->super___shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (material->super___shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pmVar1->super___shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount,
             &(material->super___shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  this_00 = (this->lastClone).
            super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (this->lastClone).super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->lastClone).super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

void insertNamedMaterial(std::string name,
                               std::shared_ptr<Material> material) {
        namedMaterial[name] = material;
        modified();
      }